

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O3

hts_itr_t * sam_itr_queryi(hts_idx_t *idx,int tid,int beg,int end)

{
  hts_itr_t *phVar1;
  hts_cram_idx_t *cidx;
  
  if (idx == (hts_idx_t *)0x0) {
    phVar1 = hts_itr_query((hts_idx_t *)0x0,tid,beg,end,sam_bam_cram_readrec);
    return phVar1;
  }
  if (idx->fmt == 3) {
    phVar1 = cram_itr_query(idx,tid,beg,end,cram_readrec);
    return phVar1;
  }
  phVar1 = hts_itr_query(idx,tid,beg,end,bam_readrec);
  return phVar1;
}

Assistant:

hts_itr_t *sam_itr_queryi(const hts_idx_t *idx, int tid, int beg, int end)
{
    const hts_cram_idx_t *cidx = (const hts_cram_idx_t *) idx;
    if (idx == NULL)
        return hts_itr_query(NULL, tid, beg, end, sam_bam_cram_readrec);
    else if (cidx->fmt == HTS_FMT_CRAI)
        return cram_itr_query(idx, tid, beg, end, cram_readrec);
    else
        return hts_itr_query(idx, tid, beg, end, bam_readrec);
}